

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options_serializer_boost_po.h
# Opt level: O2

void __thiscall
VW::config::options_serializer_boost_po::serialize<std::__cxx11::string>
          (options_serializer_boost_po *this,
          typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *typed_option)

{
  ostream *poVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_38;
  
  poVar1 = std::operator<<((ostream *)&this->field_0x18," --");
  poVar1 = std::operator<<(poVar1,(string *)&(typed_option->super_base_option).m_name);
  poVar1 = std::operator<<(poVar1," ");
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  value(&bStack_38,typed_option);
  std::operator<<(poVar1,(string *)&bStack_38);
  std::__cxx11::string::~string((string *)&bStack_38);
  return;
}

Assistant:

void serialize(typed_option<T>& typed_option)
  {
    m_output_stream << " --" << typed_option.m_name << " " << typed_option.value();
  }